

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int lua_resume(lua_State *L,int nargs)

{
  int iVar1;
  GCstr *pGVar2;
  TValue *pTVar3;
  
  if ((L->cframe == (void *)0x0) && (L->status < 2)) {
    if (L->status == 0) {
      pTVar3 = api_call_base(L,nargs);
    }
    else {
      pTVar3 = L->top + -(long)nargs;
    }
    iVar1 = lj_vm_resume(L,pTVar3,0,0);
    return iVar1;
  }
  pTVar3 = L->base;
  L->top = pTVar3;
  pGVar2 = lj_err_str(L,LJ_ERR_COSUSP);
  pTVar3->u64 = (ulong)pGVar2 | 0xfffd800000000000;
  pTVar3 = L->top;
  L->top = pTVar3 + 1;
  if ((TValue *)(L->maxstack).ptr64 <= pTVar3 + 1) {
    lj_state_growstack1(L);
  }
  return 2;
}

Assistant:

LUA_API int lua_resume(lua_State *L, int nargs)
{
  if (L->cframe == NULL && L->status <= LUA_YIELD)
    return lj_vm_resume(L,
      L->status == LUA_OK ? api_call_base(L, nargs) : L->top - nargs,
      0, 0);
  L->top = L->base;
  setstrV(L, L->top, lj_err_str(L, LJ_ERR_COSUSP));
  incr_top(L);
  return LUA_ERRRUN;
}